

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&> * __thiscall
Catch::ExprLhs<trng::mrg3s_const&>::operator!=
          (BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&> *__return_storage_ptr__,
          ExprLhs<trng::mrg3s_const&> *this,mrg3s *rhs)

{
  mrg3s *pmVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator!=(*(mrg3s **)this,rhs);
  pmVar1 = *(mrg3s **)this;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002e9dd0;
  __return_storage_ptr__->m_lhs = pmVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }